

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kriging.cpp
# Opt level: O3

void __thiscall
Kriging::Kriging(Kriging *this,vec *y,mat *X,string *covType,RegressionModel *regmodel,
                bool normalize,string *optim,string *objective,Parameters *parameters)

{
  runtime_error *this_00;
  long *plVar1;
  size_type *psVar2;
  long *plVar3;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->m_covType)._M_dataplus._M_p = (pointer)&(this->m_covType).field_2;
  (this->m_covType)._M_string_length = 0;
  (this->m_covType).field_2._M_local_buf[0] = '\0';
  (this->m_X).mem = (double *)0x0;
  (this->m_X).n_rows = 0;
  (this->m_X).n_cols = 0;
  (this->m_X).n_elem = 0;
  (this->m_X).n_alloc = 0;
  (this->m_X).vec_state = 0;
  (this->m_X).mem_state = 0;
  (this->m_centerX).super_Mat<double>.n_rows = 1;
  (this->m_centerX).super_Mat<double>.n_cols = 0;
  (this->m_centerX).super_Mat<double>.n_elem = 0;
  (this->m_centerX).super_Mat<double>.n_alloc = 0;
  (this->m_centerX).super_Mat<double>.vec_state = 2;
  (this->m_centerX).super_Mat<double>.mem_state = 0;
  (this->m_centerX).super_Mat<double>.mem = (double *)0x0;
  (this->m_scaleX).super_Mat<double>.n_rows = 1;
  (this->m_scaleX).super_Mat<double>.n_cols = 0;
  (this->m_scaleX).super_Mat<double>.n_elem = 0;
  (this->m_scaleX).super_Mat<double>.n_alloc = 0;
  (this->m_scaleX).super_Mat<double>.vec_state = 2;
  (this->m_scaleX).super_Mat<double>.mem_state = 0;
  (this->m_scaleX).super_Mat<double>.mem = (double *)0x0;
  (this->m_y).super_Mat<double>.n_rows = 0;
  (this->m_y).super_Mat<double>.n_cols = 1;
  (this->m_y).super_Mat<double>.n_elem = 0;
  (this->m_y).super_Mat<double>.n_alloc = 0;
  (this->m_y).super_Mat<double>.vec_state = 1;
  (this->m_y).super_Mat<double>.mem_state = 0;
  (this->m_y).super_Mat<double>.mem = (double *)0x0;
  this->m_centerY = 0.0;
  this->m_scaleY = 0.0;
  this->m_normalize = false;
  (this->m_optim)._M_dataplus._M_p = (pointer)&(this->m_optim).field_2;
  (this->m_optim)._M_string_length = 0;
  (this->m_optim).field_2._M_local_buf[0] = '\0';
  (this->m_objective)._M_dataplus._M_p = (pointer)&(this->m_objective).field_2;
  (this->m_objective)._M_string_length = 0;
  (this->m_objective).field_2._M_local_buf[0] = '\0';
  (this->m_dX).mem = (double *)0x0;
  (this->m_dX).vec_state = 0;
  (this->m_dX).mem_state = 0;
  (this->m_dX).n_rows = 0;
  (this->m_dX).n_cols = 0;
  (this->m_dX).n_elem = 0;
  (this->m_dX).n_alloc = 0;
  (this->m_maxdX).super_Mat<double>.n_rows = 0;
  (this->m_maxdX).super_Mat<double>.n_cols = 1;
  (this->m_maxdX).super_Mat<double>.n_elem = 0;
  (this->m_maxdX).super_Mat<double>.n_alloc = 0;
  (this->m_maxdX).super_Mat<double>.vec_state = 1;
  (this->m_maxdX).super_Mat<double>.mem_state = 0;
  (this->m_maxdX).super_Mat<double>.mem = (double *)0x0;
  (this->m_F).mem = (double *)0x0;
  (this->m_F).n_rows = 0;
  (this->m_F).n_cols = 0;
  (this->m_F).n_elem = 0;
  (this->m_F).n_alloc = 0;
  (this->m_F).vec_state = 0;
  (this->m_F).mem_state = 0;
  (this->m_T).mem = (double *)0x0;
  (this->m_T).n_rows = 0;
  (this->m_T).n_cols = 0;
  (this->m_T).n_elem = 0;
  (this->m_T).n_alloc = 0;
  (this->m_T).vec_state = 0;
  (this->m_T).mem_state = 0;
  (this->m_R).mem = (double *)0x0;
  (this->m_R).n_rows = 0;
  (this->m_R).n_cols = 0;
  (this->m_R).n_elem = 0;
  (this->m_R).n_alloc = 0;
  (this->m_R).vec_state = 0;
  (this->m_R).mem_state = 0;
  (this->m_M).mem = (double *)0x0;
  (this->m_M).n_rows = 0;
  (this->m_M).n_cols = 0;
  (this->m_M).n_elem = 0;
  (this->m_M).n_alloc = 0;
  (this->m_M).vec_state = 0;
  (this->m_M).mem_state = 0;
  (this->m_star).mem = (double *)0x0;
  (this->m_star).vec_state = 0;
  (this->m_star).mem_state = 0;
  (this->m_star).n_rows = 0;
  (this->m_star).n_cols = 0;
  (this->m_star).n_elem = 0;
  (this->m_star).n_alloc = 0;
  (this->m_circ).mem = (double *)0x0;
  (this->m_circ).vec_state = 0;
  (this->m_circ).mem_state = 0;
  (this->m_circ).n_rows = 0;
  (this->m_circ).n_cols = 0;
  (this->m_circ).n_elem = 0;
  (this->m_circ).n_alloc = 0;
  (this->m_z).super_Mat<double>.n_rows = 0;
  (this->m_z).super_Mat<double>.n_cols = 1;
  (this->m_z).super_Mat<double>.n_elem = 0;
  (this->m_z).super_Mat<double>.n_alloc = 0;
  (this->m_z).super_Mat<double>.vec_state = 1;
  (this->m_z).super_Mat<double>.mem_state = 0;
  (this->m_z).super_Mat<double>.mem = (double *)0x0;
  (this->m_beta).super_Mat<double>.n_rows = 0;
  (this->m_beta).super_Mat<double>.n_cols = 1;
  (this->m_beta).super_Mat<double>.n_elem = 0;
  (this->m_beta).super_Mat<double>.n_alloc = 0;
  (this->m_beta).super_Mat<double>.vec_state = 1;
  (this->m_beta).super_Mat<double>.mem_state = 0;
  (this->m_beta).super_Mat<double>.mem = (double *)0x0;
  this->m_est_beta = false;
  (this->m_theta).super_Mat<double>.n_rows = 0;
  (this->m_theta).super_Mat<double>.n_cols = 1;
  (this->m_theta).super_Mat<double>.n_elem = 0;
  (this->m_theta).super_Mat<double>.n_alloc = 0;
  (this->m_theta).super_Mat<double>.vec_state = 1;
  (this->m_theta).super_Mat<double>.mem_state = 0;
  (this->m_theta).super_Mat<double>.mem = (double *)0x0;
  this->m_est_theta = false;
  this->m_sigma2 = 0.0;
  this->m_est_sigma2 = false;
  this->m_is_empty = true;
  (this->lastsim_Xn_n).mem = (double *)0x0;
  (this->lastsim_Xn_n).vec_state = 0;
  (this->lastsim_Xn_n).mem_state = 0;
  (this->lastsim_Xn_n).n_rows = 0;
  (this->lastsim_Xn_n).n_cols = 0;
  (this->lastsim_Xn_n).n_elem = 0;
  (this->lastsim_Xn_n).n_alloc = 0;
  (this->lastsim_y_n).mem = (double *)0x0;
  (this->lastsim_y_n).vec_state = 0;
  (this->lastsim_y_n).mem_state = 0;
  (this->lastsim_y_n).n_rows = 0;
  (this->lastsim_y_n).n_cols = 0;
  (this->lastsim_y_n).n_elem = 0;
  (this->lastsim_y_n).n_alloc = 0;
  this->lastsim_nsim = 0;
  this->lastsim_seed = 0;
  (this->lastsim_F_n).mem = (double *)0x0;
  (this->lastsim_F_n).vec_state = 0;
  (this->lastsim_F_n).mem_state = 0;
  (this->lastsim_F_n).n_rows = 0;
  (this->lastsim_F_n).n_cols = 0;
  (this->lastsim_F_n).n_elem = 0;
  (this->lastsim_F_n).n_alloc = 0;
  (this->lastsim_R_nn).mem = (double *)0x0;
  (this->lastsim_R_nn).vec_state = 0;
  (this->lastsim_R_nn).mem_state = 0;
  (this->lastsim_R_nn).n_rows = 0;
  (this->lastsim_R_nn).n_cols = 0;
  (this->lastsim_R_nn).n_elem = 0;
  (this->lastsim_R_nn).n_alloc = 0;
  (this->lastsim_L_oCn).mem = (double *)0x0;
  (this->lastsim_L_oCn).vec_state = 0;
  (this->lastsim_L_oCn).mem_state = 0;
  (this->lastsim_L_oCn).n_rows = 0;
  (this->lastsim_L_oCn).n_cols = 0;
  (this->lastsim_L_oCn).n_elem = 0;
  (this->lastsim_L_oCn).n_alloc = 0;
  (this->lastsim_L_nCn).mem = (double *)0x0;
  (this->lastsim_L_nCn).vec_state = 0;
  (this->lastsim_L_nCn).mem_state = 0;
  (this->lastsim_L_nCn).n_rows = 0;
  (this->lastsim_L_nCn).n_cols = 0;
  (this->lastsim_L_nCn).n_elem = 0;
  (this->lastsim_L_nCn).n_alloc = 0;
  (this->lastsim_L_on).mem = (double *)0x0;
  (this->lastsim_L_on).vec_state = 0;
  (this->lastsim_L_on).mem_state = 0;
  (this->lastsim_L_on).n_rows = 0;
  (this->lastsim_L_on).n_cols = 0;
  (this->lastsim_L_on).n_elem = 0;
  (this->lastsim_L_on).n_alloc = 0;
  (this->lastsim_Rinv_on).mem = (double *)0x0;
  (this->lastsim_Rinv_on).vec_state = 0;
  (this->lastsim_Rinv_on).mem_state = 0;
  (this->lastsim_Rinv_on).n_rows = 0;
  (this->lastsim_Rinv_on).n_cols = 0;
  (this->lastsim_Rinv_on).n_elem = 0;
  (this->lastsim_Rinv_on).n_alloc = 0;
  (this->lastsim_F_on).mem = (double *)0x0;
  (this->lastsim_F_on).vec_state = 0;
  (this->lastsim_F_on).mem_state = 0;
  (this->lastsim_F_on).n_rows = 0;
  (this->lastsim_F_on).n_cols = 0;
  (this->lastsim_F_on).n_elem = 0;
  (this->lastsim_F_on).n_alloc = 0;
  (this->lastsim_Fstar_on).mem = (double *)0x0;
  (this->lastsim_Fstar_on).vec_state = 0;
  (this->lastsim_Fstar_on).mem_state = 0;
  (this->lastsim_Fstar_on).n_rows = 0;
  (this->lastsim_Fstar_on).n_cols = 0;
  (this->lastsim_Fstar_on).n_elem = 0;
  (this->lastsim_Fstar_on).n_alloc = 0;
  (this->lastsim_circ_on).mem = (double *)0x0;
  (this->lastsim_circ_on).vec_state = 0;
  (this->lastsim_circ_on).mem_state = 0;
  (this->lastsim_circ_on).n_rows = 0;
  (this->lastsim_circ_on).n_cols = 0;
  (this->lastsim_circ_on).n_elem = 0;
  (this->lastsim_circ_on).n_alloc = 0;
  (this->lastsim_Fcirc_on).mem = (double *)0x0;
  (this->lastsim_Fcirc_on).vec_state = 0;
  (this->lastsim_Fcirc_on).mem_state = 0;
  (this->lastsim_Fcirc_on).n_rows = 0;
  (this->lastsim_Fcirc_on).n_cols = 0;
  (this->lastsim_Fcirc_on).n_elem = 0;
  (this->lastsim_Fcirc_on).n_alloc = 0;
  (this->lastsim_Fhat_nKo).mem = (double *)0x0;
  (this->lastsim_Fhat_nKo).vec_state = 0;
  (this->lastsim_Fhat_nKo).mem_state = 0;
  (this->lastsim_Fhat_nKo).n_rows = 0;
  (this->lastsim_Fhat_nKo).n_cols = 0;
  (this->lastsim_Fhat_nKo).n_elem = 0;
  (this->lastsim_Fhat_nKo).n_alloc = 0;
  (this->lastsim_Ecirc_nKo).mem = (double *)0x0;
  (this->lastsim_Ecirc_nKo).vec_state = 0;
  (this->lastsim_Ecirc_nKo).mem_state = 0;
  (this->lastsim_Ecirc_nKo).n_rows = 0;
  (this->lastsim_Ecirc_nKo).n_cols = 0;
  (this->lastsim_Ecirc_nKo).n_elem = 0;
  (this->lastsim_Ecirc_nKo).n_alloc = 0;
  (this->lastsimup_Xn_u).mem = (double *)0x0;
  (this->lastsimup_Xn_u).vec_state = 0;
  (this->lastsimup_Xn_u).mem_state = 0;
  (this->lastsimup_Xn_u).n_rows = 0;
  (this->lastsimup_Xn_u).n_cols = 0;
  (this->lastsimup_Xn_u).n_elem = 0;
  (this->lastsimup_Xn_u).n_alloc = 0;
  (this->lastsimup_y_u).mem = (double *)0x0;
  (this->lastsimup_y_u).vec_state = 0;
  (this->lastsimup_y_u).mem_state = 0;
  (this->lastsimup_y_u).n_rows = 0;
  (this->lastsimup_y_u).n_cols = 0;
  (this->lastsimup_y_u).n_elem = 0;
  (this->lastsimup_y_u).n_alloc = 0;
  (this->lastsimup_Wtild_nKu).mem = (double *)0x0;
  (this->lastsimup_Wtild_nKu).vec_state = 0;
  (this->lastsimup_Wtild_nKu).mem_state = 0;
  (this->lastsimup_Wtild_nKu).n_rows = 0;
  (this->lastsimup_Wtild_nKu).n_cols = 0;
  (this->lastsimup_Wtild_nKu).n_elem = 0;
  (this->lastsimup_Wtild_nKu).n_alloc = 0;
  (this->lastsimup_R_uo).mem = (double *)0x0;
  (this->lastsimup_R_uo).vec_state = 0;
  (this->lastsimup_R_uo).mem_state = 0;
  (this->lastsimup_R_uo).n_rows = 0;
  (this->lastsimup_R_uo).n_cols = 0;
  (this->lastsimup_R_uo).n_elem = 0;
  (this->lastsimup_R_uo).n_alloc = 0;
  (this->lastsimup_R_un).mem = (double *)0x0;
  (this->lastsimup_R_un).vec_state = 0;
  (this->lastsimup_R_un).mem_state = 0;
  (this->lastsimup_R_un).n_rows = 0;
  (this->lastsimup_R_un).n_cols = 0;
  (this->lastsimup_R_un).n_elem = 0;
  (this->lastsimup_R_un).n_alloc = 0;
  (this->lastsimup_R_uu).mem = (double *)0x0;
  (this->lastsimup_R_uu).vec_state = 0;
  (this->lastsimup_R_uu).mem_state = 0;
  (this->lastsimup_R_uu).n_rows = 0;
  (this->lastsimup_R_uu).n_cols = 0;
  (this->lastsimup_R_uu).n_elem = 0;
  (this->lastsimup_R_uu).n_alloc = 0;
  this->_Cov_pow = 0.0;
  (this->_DlnCovDx).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->_DlnCovDx)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->_DlnCovDx).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->_DlnCovDx).super__Function_base._M_functor + 8) = 0;
  (this->_DlnCovDtheta).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->_DlnCovDtheta)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->_DlnCovDtheta).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->_DlnCovDtheta).super__Function_base._M_functor + 8) = 0;
  (this->_Cov).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->_Cov)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->_Cov).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->_Cov).super__Function_base._M_functor + 8) = 0;
  if ((y->super_Mat<double>).n_elem == X->n_rows) {
    make_Cov(this,covType);
    fit(this,y,X,regmodel,normalize,optim,objective,parameters);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_f0,X->n_rows);
  std::operator+(&local_90,"Dimension of new data should be the same:\n X: (",&local_f0);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_130._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_130._M_dataplus._M_p == psVar2) {
    local_130.field_2._M_allocated_capacity = *psVar2;
    local_130.field_2._8_8_ = plVar1[3];
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  }
  else {
    local_130.field_2._M_allocated_capacity = *psVar2;
  }
  local_130._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::to_string(&local_b0,X->n_cols);
  std::operator+(&local_70,&local_130,&local_b0);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_110._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_110._M_dataplus._M_p == psVar2) {
    local_110.field_2._M_allocated_capacity = *psVar2;
    local_110.field_2._8_8_ = plVar1[3];
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar2;
  }
  local_110._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::to_string(&local_d0,(y->super_Mat<double>).n_elem);
  std::operator+(&local_50,&local_110,&local_d0);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_150 = (long *)*plVar1;
  plVar3 = plVar1 + 2;
  if (local_150 == plVar3) {
    local_140 = *plVar3;
    lStack_138 = plVar1[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *plVar3;
  }
  local_148 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_150);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

LIBKRIGING_EXPORT Kriging::Kriging(const arma::vec& y,
                                   const arma::mat& X,
                                   const std::string& covType,
                                   const Trend::RegressionModel& regmodel,
                                   bool normalize,
                                   const std::string& optim,
                                   const std::string& objective,
                                   const Parameters& parameters) {
  if (y.n_elem != X.n_rows)
    throw std::runtime_error("Dimension of new data should be the same:\n X: (" + std::to_string(X.n_rows) + "x"
                             + std::to_string(X.n_cols) + "), y: (" + std::to_string(y.n_elem) + ")");

  make_Cov(covType);
  fit(y, X, regmodel, normalize, optim, objective, parameters);
}